

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O0

void __thiscall
OpenMD::HBondJump::processNonOverlapping
          (HBondJump *this,int frame,SelectionManager *sman1,SelectionManager *sman2)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  int in_ESI;
  long in_RDI;
  int aInd;
  int index;
  int hInd;
  Atom *hba;
  iterator hbai;
  HBondDonor *hbd;
  iterator hbdi;
  int j;
  int i;
  Molecule *mol2;
  Molecule *mol1;
  reference in_stack_ffffffffffffff78;
  reference in_stack_ffffffffffffff88;
  Atom *local_58;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_50;
  HBondDonor *local_48;
  __normal_iterator<OpenMD::Molecule::HBondDonor_**,_std::vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>_>
  local_40 [2];
  Molecule *local_30;
  Molecule *local_28;
  int local_c;
  
  local_c = in_ESI;
  __gnu_cxx::
  __normal_iterator<OpenMD::Molecule::HBondDonor_**,_std::vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>_>
  ::__normal_iterator(local_40);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_50);
  local_28 = SelectionManager::beginSelectedMolecule
                       ((SelectionManager *)in_stack_ffffffffffffff78._M_mask,
                        (int *)in_stack_ffffffffffffff78._M_p);
  while (local_28 != (Molecule *)0x0) {
    local_30 = SelectionManager::beginSelectedMolecule
                         ((SelectionManager *)in_stack_ffffffffffffff78._M_mask,
                          (int *)in_stack_ffffffffffffff78._M_p);
    while (local_30 != (Molecule *)0x0) {
      local_48 = Molecule::beginHBondDonor
                           ((Molecule *)in_stack_ffffffffffffff88._M_mask,
                            (iterator *)in_stack_ffffffffffffff88._M_p);
      while (local_48 != (HBondDonor *)0x0) {
        iVar1 = StuntDouble::getGlobalIndex(&local_48->donatedHydrogen->super_StuntDouble);
        pvVar3 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)(in_RDI + 0xe40),(long)local_c);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(long)iVar1);
        iVar1 = *pvVar4;
        pvVar3 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)(in_RDI + 0xe70),(long)local_c);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(long)iVar1);
        iVar1 = *pvVar4;
        local_58 = Molecule::beginHBondAcceptor
                             ((Molecule *)in_stack_ffffffffffffff88._M_mask,
                              (iterator *)in_stack_ffffffffffffff88._M_p);
        while (local_58 != (Atom *)0x0) {
          iVar2 = StuntDouble::getGlobalIndex(&local_58->super_StuntDouble);
          if (iVar2 == iVar1) {
            std::
            vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                          *)(in_RDI + 0xea0),(long)local_c);
            in_stack_ffffffffffffff88 =
                 std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff88._M_mask
                            ,(size_type)in_stack_ffffffffffffff88._M_p);
            std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffff88,true);
          }
          local_58 = Molecule::nextHBondAcceptor
                               ((Molecule *)in_stack_ffffffffffffff88._M_mask,
                                (iterator *)in_stack_ffffffffffffff88._M_p);
        }
        local_48 = Molecule::nextHBondDonor
                             ((Molecule *)in_stack_ffffffffffffff88._M_mask,
                              (iterator *)in_stack_ffffffffffffff88._M_p);
      }
      local_48 = Molecule::beginHBondDonor
                           ((Molecule *)in_stack_ffffffffffffff88._M_mask,
                            (iterator *)in_stack_ffffffffffffff88._M_p);
      while (local_48 != (HBondDonor *)0x0) {
        iVar1 = StuntDouble::getGlobalIndex(&local_48->donatedHydrogen->super_StuntDouble);
        pvVar3 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)(in_RDI + 0xe40),(long)local_c);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(long)iVar1);
        iVar1 = *pvVar4;
        pvVar3 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)(in_RDI + 0xe70),(long)local_c);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(long)iVar1);
        iVar1 = *pvVar4;
        local_58 = Molecule::beginHBondAcceptor
                             ((Molecule *)in_stack_ffffffffffffff88._M_mask,
                              (iterator *)in_stack_ffffffffffffff88._M_p);
        while (local_58 != (Atom *)0x0) {
          iVar2 = StuntDouble::getGlobalIndex(&local_58->super_StuntDouble);
          if (iVar2 == iVar1) {
            std::
            vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                          *)(in_RDI + 0xea0),(long)local_c);
            in_stack_ffffffffffffff78 =
                 std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff88._M_mask
                            ,(size_type)in_stack_ffffffffffffff88._M_p);
            std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffff78,true);
          }
          local_58 = Molecule::nextHBondAcceptor
                               ((Molecule *)in_stack_ffffffffffffff88._M_mask,
                                (iterator *)in_stack_ffffffffffffff88._M_p);
        }
        local_48 = Molecule::nextHBondDonor
                             ((Molecule *)in_stack_ffffffffffffff88._M_mask,
                              (iterator *)in_stack_ffffffffffffff88._M_p);
      }
      local_30 = SelectionManager::nextSelectedMolecule
                           ((SelectionManager *)in_stack_ffffffffffffff78._M_mask,
                            (int *)in_stack_ffffffffffffff78._M_p);
    }
    local_28 = SelectionManager::nextSelectedMolecule
                         ((SelectionManager *)in_stack_ffffffffffffff78._M_mask,
                          (int *)in_stack_ffffffffffffff78._M_p);
  }
  return;
}

Assistant:

void HBondJump::processNonOverlapping(int frame, SelectionManager& sman1,
                                        SelectionManager& sman2) {
    Molecule* mol1;
    Molecule* mol2;
    int i, j;
    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    Molecule::HBondDonor* hbd;
    std::vector<Atom*>::iterator hbai;
    Atom* hba;
    int hInd, index, aInd;

    // This is the same as a non-overlapping pairwise loop structure:
    // for (int i = 0;  i < ni ; ++i ) {
    //   for (int j = 0; j < nj; ++j) {}
    // }

    for (mol1 = sman1.beginSelectedMolecule(i); mol1 != NULL;
         mol1 = sman1.nextSelectedMolecule(i)) {
      for (mol2 = sman2.beginSelectedMolecule(j); mol2 != NULL;
           mol2 = sman2.nextSelectedMolecule(j)) {
        // loop over the possible donors in molecule 1:
        for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
             hbd = mol1->nextHBondDonor(hbdi)) {
          hInd  = hbd->donatedHydrogen->getGlobalIndex();
          index = GIDtoH_[frame][hInd];
          aInd  = acceptor_[frame][index];

          for (hba = mol2->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol2->nextHBondAcceptor(hbai)) {
            if (hba->getGlobalIndex() == aInd) {
              selected_[frame][index] = true;
            }
          }
        }

        // loop over the possible donors in molecule 2:
        for (hbd = mol2->beginHBondDonor(hbdi); hbd != NULL;
             hbd = mol2->nextHBondDonor(hbdi)) {
          hInd  = hbd->donatedHydrogen->getGlobalIndex();
          index = GIDtoH_[frame][hInd];
          aInd  = acceptor_[frame][index];

          for (hba = mol1->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol1->nextHBondAcceptor(hbai)) {
            if (hba->getGlobalIndex() == aInd) {
              selected_[frame][index] = true;
            }
          }
        }
      }
    }
  }